

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

TestCase *
vkt::pipeline::anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::BasicGraphicsTest>
          (TestContext *testContext,TimestampTestParam *testParam)

{
  BasicGraphicsTest *this;
  allocator<char> local_9a;
  allocator<char> local_99;
  char *local_98 [4];
  string local_78;
  char *local_58 [4];
  string local_38;
  
  this = (BasicGraphicsTest *)operator_new(0x90);
  (**testParam->_vptr_TimestampTestParam)(local_58,testParam);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,local_58[0],&local_99);
  (*testParam->_vptr_TimestampTestParam[1])(local_98,testParam);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_98[0],&local_9a);
  BasicGraphicsTest::BasicGraphicsTest(this,testContext,&local_38,&local_78,testParam);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)local_58);
  return (TestCase *)this;
}

Assistant:

vkt::TestCase* newTestCase(tcu::TestContext&     testContext,
						   TimestampTestParam*   testParam)
{
	return new Test(testContext,
					testParam->generateTestName().c_str(),
					testParam->generateTestDescription().c_str(),
					testParam);
}